

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::value(KeyFrames<float,_void> *this,int frameNo)

{
  bool bVar1;
  const_reference pvVar2;
  reference pFVar3;
  int in_ESI;
  Frame *in_RDI;
  float fVar4;
  Frame *keyFrame;
  const_iterator __end0;
  const_iterator __begin0;
  vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
  *__range3;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  __normal_iterator<const_rlottie::internal::model::KeyFrames<float,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>_>
  local_28 [2];
  int local_14;
  float local_4;
  
  local_14 = in_ESI;
  pvVar2 = std::
           vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
           ::front((vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
                    *)in_RDI);
  if (pvVar2->start_ < (float)local_14) {
    pvVar2 = std::
             vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
             ::back((vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
                     *)in_RDI);
    if ((float)local_14 < pvVar2->end_) {
      local_28[0]._M_current =
           (Frame *)std::
                    vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
                    ::begin((vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
                             *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      std::
      vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
      ::end((vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
             *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_rlottie::internal::model::KeyFrames<float,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>_>
                                 *)in_RDI,
                                (__normal_iterator<const_rlottie::internal::model::KeyFrames<float,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
            bVar1) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<const_rlottie::internal::model::KeyFrames<float,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>_>
                 ::operator*(local_28);
        if ((pFVar3->start_ <= (float)local_14) && ((float)local_14 < pFVar3->end_)) {
          fVar4 = Frame::value(in_RDI,in_stack_ffffffffffffffbc);
          return fVar4;
        }
        __gnu_cxx::
        __normal_iterator<const_rlottie::internal::model::KeyFrames<float,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>_>
        ::operator++(local_28);
      }
      local_4 = 0.0;
    }
    else {
      pvVar2 = std::
               vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
               ::back((vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
                       *)in_RDI);
      local_4 = (pvVar2->value_).end_;
    }
  }
  else {
    pvVar2 = std::
             vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
             ::front((vector<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
                      *)in_RDI);
    local_4 = (pvVar2->value_).start_;
  }
  return local_4;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }